

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86_usability.h
# Opt level: O0

int FastDivider_epu32::portable_ceil_log2(int d)

{
  uint uVar1;
  int d_local;
  
  uVar1 = 0x1f;
  if (d - 1U != 0) {
    for (; d - 1U >> uVar1 == 0; uVar1 = uVar1 - 1) {
    }
  }
  return 0x20 - (uVar1 ^ 0x1f);
}

Assistant:

static int portable_ceil_log2(int d)
    {
#ifdef _MSC_VER
        unsigned long index;
        _BitScanReverse(&index, d - 1);
        return index + 1;
#else
        return 32 - __builtin_clz(d - 1);
#endif
    }